

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

iterator __thiscall
QHash<QByteArray,_QHashDummyValue>::emplace<QHashDummyValue>
          (QHash<QByteArray,_QHashDummyValue> *this,QByteArray *key,QHashDummyValue *args)

{
  long lVar1;
  bool bVar2;
  undefined8 *in_RDI;
  long in_FS_OFFSET;
  iterator iVar3;
  QHash<QByteArray,_QHashDummyValue> copy;
  QHash<QByteArray,_QHashDummyValue> *in_stack_ffffffffffffff78;
  QHash<QByteArray,_QHashDummyValue> *in_stack_ffffffffffffff80;
  QHashDummyValue *in_stack_ffffffffffffff88;
  QByteArray *in_stack_ffffffffffffff90;
  QHash<QByteArray,_QHashDummyValue> *in_stack_ffffffffffffff98;
  undefined1 local_28 [16];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = isDetached(in_stack_ffffffffffffff80);
  if (bVar2) {
    bVar2 = QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_>::shouldGrow
                      ((Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_> *)*in_RDI);
    if (bVar2) {
      local_28 = (undefined1  [16])
                 emplace_helper<QHashDummyValue>
                           (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                            in_stack_ffffffffffffff88);
    }
    else {
      local_28 = (undefined1  [16])
                 emplace_helper<QHashDummyValue>
                           (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                            in_stack_ffffffffffffff88);
    }
  }
  else {
    QHash(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    detach(in_stack_ffffffffffffff80);
    local_28 = (undefined1  [16])
               emplace_helper<QHashDummyValue>
                         (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                          in_stack_ffffffffffffff88);
    ~QHash(in_stack_ffffffffffffff80);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    iVar3.i.d = (Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_> *)local_28._0_8_;
    iVar3.i.bucket = local_28._8_8_;
    return (iterator)iVar3.i;
  }
  __stack_chk_fail();
}

Assistant:

iterator emplace(Key &&key, Args &&... args)
    {
        if (isDetached()) {
            if (d->shouldGrow()) // Construct the value now so that no dangling references are used
                return emplace_helper(std::move(key), T(std::forward<Args>(args)...));
            return emplace_helper(std::move(key), std::forward<Args>(args)...);
        }
        // else: we must detach
        const auto copy = *this; // keep 'args' alive across the detach/growth
        detach();
        return emplace_helper(std::move(key), std::forward<Args>(args)...);
    }